

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddRow(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *row,bool scale)

{
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  DataKey *pDVar1;
  uint *puVar2;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  pointer pnVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  bool bVar6;
  uint uVar7;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar8;
  int iVar9;
  long lVar10;
  undefined7 in_register_00000011;
  int iVar11;
  double dVar12;
  cpp_dec_float<100U,_int,_void> *pcVar13;
  double dVar14;
  long in_FS_OFFSET;
  int idx;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  empty;
  int local_318;
  uint local_314;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_310;
  Item *local_308;
  int local_300;
  int local_2fc;
  double local_2f8;
  undefined8 uStack_2f0;
  DataKey local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d8;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  int local_248;
  undefined1 local_244;
  undefined8 local_240;
  undefined1 local_238 [8];
  DataKey DStack_230;
  uint local_228 [11];
  undefined3 uStack_1fb;
  int iStack_1f8;
  bool bStack_1f4;
  undefined8 local_1f0;
  undefined **local_148;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  int local_e8;
  undefined1 local_e4;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  undefined1 local_94;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  undefined1 local_44;
  undefined8 local_40;
  
  local_318 = (this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
  local_300 = (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
  local_238._0_4_ = 0;
  local_238._4_4_ = -1;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add(&this->
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ,(DataKey *)local_238,row);
  local_308 = (this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[local_318].idx;
  local_314 = 0;
  local_2fc = (int)CONCAT71(in_register_00000011,scale);
  local_310 = this;
  if ((local_2fc != 0) &&
     (pSVar3 = this->lp_scaler,
     pSVar3 != (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0)) {
    local_314 = (*pSVar3->_vptr_SPxScaler[1])
                          (pSVar3,local_308,
                           &(this->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).scaleExp);
    pcVar13 = &(this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_318].m_backend;
    ::soplex::infinity::__tls_init();
    local_2f8 = *(double *)(in_FS_OFFSET + -8);
    local_1f0._0_4_ = cpp_dec_float_finite;
    local_1f0._4_4_ = 0x10;
    local_238._0_4_ = 0;
    local_238._4_4_ = 0;
    DStack_230.info = 0;
    DStack_230.idx = 0;
    local_228[0] = 0;
    local_228[1] = 0;
    local_228[2] = 0;
    local_228[3] = 0;
    local_228[4] = 0;
    local_228[5] = 0;
    local_228[6] = 0;
    local_228[7] = 0;
    local_228[8] = 0;
    local_228[9] = 0;
    stack0xfffffffffffffe00 = 0;
    uStack_1fb = 0;
    iStack_1f8 = 0;
    bStack_1f4 = false;
    uStack_2f0 = 0;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)local_238,local_2f8);
    if ((pcVar13->fpclass != cpp_dec_float_NaN) &&
       (((fpclass_type)local_1f0 != cpp_dec_float_NaN &&
        (iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (pcVar13,(cpp_dec_float<100U,_int,_void> *)local_238), pSVar8 = local_310
        , iVar9 < 0)))) {
      lVar10 = (long)local_318;
      pnVar4 = (local_310->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_88 = *(undefined8 *)&pnVar4[lVar10].m_backend.data;
      uStack_80 = *(undefined8 *)(pnVar4[lVar10].m_backend.data._M_elems + 2);
      puVar2 = pnVar4[lVar10].m_backend.data._M_elems + 4;
      local_78 = *(undefined8 *)puVar2;
      uStack_70 = *(undefined8 *)(puVar2 + 2);
      puVar2 = pnVar4[lVar10].m_backend.data._M_elems + 8;
      local_68 = *(undefined8 *)puVar2;
      uStack_60 = *(undefined8 *)(puVar2 + 2);
      puVar2 = pnVar4[lVar10].m_backend.data._M_elems + 0xc;
      local_58 = *(undefined8 *)puVar2;
      uStack_50 = *(undefined8 *)(puVar2 + 2);
      local_48 = pnVar4[lVar10].m_backend.exp;
      local_44 = pnVar4[lVar10].m_backend.neg;
      local_40._0_4_ = pnVar4[lVar10].m_backend.fpclass;
      local_40._4_4_ = pnVar4[lVar10].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)local_238,(soplex *)&local_88,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)local_314,(int)pnVar4);
      lVar10 = (long)local_318;
      pnVar4 = (pSVar8->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = pnVar4[lVar10].m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = local_228._32_8_;
      *(ulong *)(puVar2 + 2) = CONCAT35(uStack_1fb,stack0xfffffffffffffe00);
      puVar2 = pnVar4[lVar10].m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = local_228._16_8_;
      *(undefined8 *)(puVar2 + 2) = local_228._24_8_;
      puVar2 = pnVar4[lVar10].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = local_228._0_8_;
      *(undefined8 *)(puVar2 + 2) = local_228._8_8_;
      pDVar1 = (DataKey *)(pnVar4 + lVar10);
      pDVar1->info = local_238._0_4_;
      pDVar1->idx = local_238._4_4_;
      pDVar1[1] = DStack_230;
      pnVar4[lVar10].m_backend.exp = iStack_1f8;
      pnVar4[lVar10].m_backend.neg = bStack_1f4;
      pnVar4[lVar10].m_backend.fpclass = (fpclass_type)local_1f0;
      pnVar4[lVar10].m_backend.prec_elem = local_1f0._4_4_;
    }
    pcVar13 = &(local_310->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_318].m_backend;
    ::soplex::infinity::__tls_init();
    local_1f0._0_4_ = cpp_dec_float_finite;
    local_1f0._4_4_ = 0x10;
    local_238._0_4_ = 0;
    local_238._4_4_ = 0;
    DStack_230.info = 0;
    DStack_230.idx = 0;
    local_228[0] = 0;
    local_228[1] = 0;
    local_228[2] = 0;
    local_228[3] = 0;
    local_228[4] = 0;
    local_228[5] = 0;
    local_228[6] = 0;
    local_228[7] = 0;
    local_228[8] = 0;
    local_228[9] = 0;
    stack0xfffffffffffffe00 = 0;
    uStack_1fb = 0;
    iStack_1f8 = 0;
    bStack_1f4 = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)local_238,-local_2f8);
    this = local_310;
    if (((pcVar13->fpclass != cpp_dec_float_NaN) && ((fpclass_type)local_1f0 != cpp_dec_float_NaN))
       && (iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar13,(cpp_dec_float<100U,_int,_void> *)local_238), this = local_310
          , 0 < iVar9)) {
      lVar10 = (long)local_318;
      pnVar4 = (local_310->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_d8 = *(undefined8 *)&pnVar4[lVar10].m_backend.data;
      uStack_d0 = *(undefined8 *)(pnVar4[lVar10].m_backend.data._M_elems + 2);
      puVar2 = pnVar4[lVar10].m_backend.data._M_elems + 4;
      local_c8 = *(undefined8 *)puVar2;
      uStack_c0 = *(undefined8 *)(puVar2 + 2);
      puVar2 = pnVar4[lVar10].m_backend.data._M_elems + 8;
      local_b8 = *(undefined8 *)puVar2;
      uStack_b0 = *(undefined8 *)(puVar2 + 2);
      puVar2 = pnVar4[lVar10].m_backend.data._M_elems + 0xc;
      local_a8 = *(undefined8 *)puVar2;
      uStack_a0 = *(undefined8 *)(puVar2 + 2);
      local_98 = pnVar4[lVar10].m_backend.exp;
      local_94 = pnVar4[lVar10].m_backend.neg;
      local_90._0_4_ = pnVar4[lVar10].m_backend.fpclass;
      local_90._4_4_ = pnVar4[lVar10].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)local_238,(soplex *)&local_d8,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)local_314,(int)pnVar4);
      lVar10 = (long)local_318;
      pnVar4 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = pnVar4[lVar10].m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = local_228._32_8_;
      *(ulong *)(puVar2 + 2) = CONCAT35(uStack_1fb,stack0xfffffffffffffe00);
      puVar2 = pnVar4[lVar10].m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = local_228._16_8_;
      *(undefined8 *)(puVar2 + 2) = local_228._24_8_;
      puVar2 = pnVar4[lVar10].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = local_228._0_8_;
      *(undefined8 *)(puVar2 + 2) = local_228._8_8_;
      pDVar1 = (DataKey *)(pnVar4 + lVar10);
      pDVar1->info = local_238._0_4_;
      pDVar1->idx = local_238._4_4_;
      pDVar1[1] = DStack_230;
      pnVar4[lVar10].m_backend.exp = iStack_1f8;
      pnVar4[lVar10].m_backend.neg = bStack_1f4;
      pnVar4[lVar10].m_backend.fpclass = (fpclass_type)local_1f0;
      pnVar4[lVar10].m_backend.prec_elem = local_1f0._4_4_;
    }
    uVar7 = local_314;
    lVar10 = (long)local_318;
    pnVar4 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_128 = *(undefined8 *)&pnVar4[lVar10].m_backend.data;
    uStack_120 = *(undefined8 *)(pnVar4[lVar10].m_backend.data._M_elems + 2);
    puVar2 = pnVar4[lVar10].m_backend.data._M_elems + 4;
    local_118 = *(undefined8 *)puVar2;
    uStack_110 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar4[lVar10].m_backend.data._M_elems + 8;
    local_108 = *(undefined8 *)puVar2;
    uStack_100 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar4[lVar10].m_backend.data._M_elems + 0xc;
    local_f8 = *(undefined8 *)puVar2;
    uStack_f0 = *(undefined8 *)(puVar2 + 2);
    local_e8 = pnVar4[lVar10].m_backend.exp;
    local_e4 = pnVar4[lVar10].m_backend.neg;
    local_e0._0_4_ = pnVar4[lVar10].m_backend.fpclass;
    local_e0._4_4_ = pnVar4[lVar10].m_backend.prec_elem;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)local_238,(soplex *)&local_128,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)local_314,(int)pnVar4);
    lVar10 = (long)local_318;
    pnVar4 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = pnVar4[lVar10].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar2 = local_228._32_8_;
    *(ulong *)(puVar2 + 2) = CONCAT35(uStack_1fb,stack0xfffffffffffffe00);
    puVar2 = pnVar4[lVar10].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar2 = local_228._16_8_;
    *(undefined8 *)(puVar2 + 2) = local_228._24_8_;
    puVar2 = pnVar4[lVar10].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = local_228._0_8_;
    *(undefined8 *)(puVar2 + 2) = local_228._8_8_;
    pDVar1 = (DataKey *)(pnVar4 + lVar10);
    pDVar1->info = local_238._0_4_;
    pDVar1->idx = local_238._4_4_;
    pDVar1[1] = DStack_230;
    pnVar4[lVar10].m_backend.exp = iStack_1f8;
    pnVar4[lVar10].m_backend.neg = bStack_1f4;
    pnVar4[lVar10].m_backend.fpclass = (fpclass_type)local_1f0;
    pnVar4[lVar10].m_backend.prec_elem = local_1f0._4_4_;
    (this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).scaleExp.data[local_318] = uVar7;
  }
  dVar14 = (double)(long)(local_308->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
  if (0 < (long)dVar14) {
    this_00 = &this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    do {
      dVar12 = (double)((long)dVar14 + -1);
      iVar9 = (local_308->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem[(long)dVar14 + -1].idx;
      if ((char)local_2fc != '\0') {
        pNVar5 = (local_308->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        local_288 = *(undefined8 *)&pNVar5[(long)dVar12].val.m_backend.data;
        uStack_280 = *(undefined8 *)(pNVar5[(long)dVar12].val.m_backend.data._M_elems + 2);
        puVar2 = pNVar5[(long)dVar12].val.m_backend.data._M_elems + 4;
        local_278 = *(undefined8 *)puVar2;
        uStack_270 = *(undefined8 *)(puVar2 + 2);
        puVar2 = pNVar5[(long)dVar12].val.m_backend.data._M_elems + 8;
        local_268 = *(undefined8 *)puVar2;
        uStack_260 = *(undefined8 *)(puVar2 + 2);
        puVar2 = pNVar5[(long)dVar12].val.m_backend.data._M_elems + 0xc;
        local_258 = *(undefined8 *)puVar2;
        uStack_250 = *(undefined8 *)(puVar2 + 2);
        local_248 = pNVar5[(long)dVar12].val.m_backend.exp;
        local_244 = pNVar5[(long)dVar12].val.m_backend.neg;
        local_240._0_4_ = pNVar5[(long)dVar12].val.m_backend.fpclass;
        local_240._4_4_ = pNVar5[(long)dVar12].val.m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)local_238,(soplex *)&local_288,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)((local_310->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).scaleExp.data[iVar9] + local_314),
                   CONCAT31((int3)((uint)local_248 >> 8),local_244));
        pNVar5 = (local_308->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        puVar2 = pNVar5[(long)dVar12].val.m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar2 = local_228._32_8_;
        *(ulong *)(puVar2 + 2) = CONCAT35(uStack_1fb,stack0xfffffffffffffe00);
        puVar2 = pNVar5[(long)dVar12].val.m_backend.data._M_elems + 8;
        *(undefined8 *)puVar2 = local_228._16_8_;
        *(undefined8 *)(puVar2 + 2) = local_228._24_8_;
        puVar2 = pNVar5[(long)dVar12].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = local_228._0_8_;
        *(undefined8 *)(puVar2 + 2) = local_228._8_8_;
        *(undefined1 (*) [8])&pNVar5[(long)dVar12].val.m_backend.data = local_238;
        *(DataKey *)(pNVar5[(long)dVar12].val.m_backend.data._M_elems + 2) = DStack_230;
        pNVar5[(long)dVar12].val.m_backend.exp = iStack_1f8;
        pNVar5[(long)dVar12].val.m_backend.neg = bStack_1f4;
        pNVar5[(long)dVar12].val.m_backend.fpclass = (fpclass_type)local_1f0;
        pNVar5[(long)dVar12].val.m_backend.prec_elem = local_1f0._4_4_;
        this = local_310;
      }
      pNVar5 = (local_308->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      local_2d8.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)&pNVar5[(long)dVar12].val.m_backend.data;
      local_2d8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pNVar5[(long)dVar12].val.m_backend.data._M_elems + 2);
      puVar2 = pNVar5[(long)dVar12].val.m_backend.data._M_elems + 4;
      local_2d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_2d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = pNVar5[(long)dVar12].val.m_backend.data._M_elems + 8;
      local_2d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
      local_2d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = pNVar5[(long)dVar12].val.m_backend.data._M_elems + 0xc;
      local_2d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
      local_2d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
      local_2d8.m_backend.exp = pNVar5[(long)dVar12].val.m_backend.exp;
      local_2d8.m_backend.neg = pNVar5[(long)dVar12].val.m_backend.neg;
      local_2d8.m_backend.fpclass = pNVar5[(long)dVar12].val.m_backend.fpclass;
      local_2d8.m_backend.prec_elem = pNVar5[(long)dVar12].val.m_backend.prec_elem;
      if ((this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum <= iVar9) {
        local_2f8 = dVar12;
        LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::LPColBase((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)local_238,0);
        iVar11 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        if (iVar11 <= iVar9) {
          iVar11 = (iVar9 - iVar11) + 1;
          do {
            local_2e0.info = 0;
            local_2e0.idx = -1;
            LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(this_00,&local_2e0,
                  (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)local_238);
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
        }
        local_148 = &PTR__DSVectorBase_006b0b50;
        this = local_310;
        dVar12 = local_2f8;
        if (local_130 !=
            (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0) {
          free(local_130);
          local_130 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x0;
          this = local_310;
          dVar12 = local_2f8;
        }
      }
      LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add2(this_00,iVar9,1,&local_318,&local_2d8);
      bVar6 = 1 < (long)dVar14;
      dVar14 = dVar12;
    } while (bVar6);
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])(this,1);
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x51])
            (this,(ulong)(uint)((this->
                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum - local_300));
  return;
}

Assistant:

void doAddRow(const LPRowBase<R>& row, bool scale = false)
   {
      int idx = nRows();
      int oldColNumber = nCols();
      int newRowScaleExp = 0;

      LPRowSetBase<R>::add(row);

      SVectorBase<R>& vec = rowVector_w(idx);

      DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

      // compute new row scaling factor and apply it to the sides
      if(scale && lp_scaler)
      {
         newRowScaleExp = lp_scaler->computeScaleExp(vec, colscaleExp);

         if(rhs(idx) < R(infinity))
            rhs_w(idx) = spxLdexp(rhs_w(idx), newRowScaleExp);

         if(lhs(idx) > R(-infinity))
            lhs_w(idx) = spxLdexp(lhs_w(idx), newRowScaleExp);

         maxRowObj_w(idx) = spxLdexp(maxRowObj_w(idx), newRowScaleExp);

         LPRowSetBase<R>::scaleExp[idx] = newRowScaleExp;
      }

      // now insert nonzeros to column file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new row and existing column scaling factors to new values in RowSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[i]);

         R val = vec.value(j);

         // create new columns if required
         if(i >= nCols())
         {
            LPColBase<R> empty;

            for(int k = nCols(); k <= i; ++k)
               LPColSetBase<R>::add(empty);
         }

         assert(i < nCols());
         LPColSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedRows(1);
      addedCols(nCols() - oldColNumber);
   }